

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O2

IterateResult __thiscall deqp::ShaderRenderCase::iterate(ShaderRenderCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  char *description;
  Surface resImage;
  Surface refImage;
  IVec2 viewportSize;
  QuadGrid quadGrid;
  long lVar4;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"ShaderRenderCase::iterate() begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
                  ,0x1d8);
  dVar3 = (this->m_program->m_program).m_program;
  (**(code **)(lVar4 + 0x1680))(dVar3);
  getViewportSize((ShaderRenderCase *)&viewportSize);
  iVar2 = 4;
  if (this->m_isVertexCase != false) {
    iVar2 = 0x40;
  }
  resImage.m_width = 0;
  resImage.m_height = 0;
  resImage.m_pixels.m_ptr = (void *)0x3f80000000000000;
  QuadGrid::QuadGrid(&quadGrid,iVar2,viewportSize.m_data[0],viewportSize.m_data[1],(Vec4 *)&resImage
                     ,&this->m_userAttribTransforms,&this->m_textures);
  tcu::Surface::Surface(&resImage,viewportSize.m_data[0],viewportSize.m_data[1]);
  render(this,&resImage,dVar3,&quadGrid);
  tcu::Surface::Surface(&refImage,viewportSize.m_data[0],viewportSize.m_data[1]);
  if (this->m_isVertexCase == true) {
    computeVertexReference(this,&refImage,&quadGrid);
  }
  else {
    computeFragmentReference(this,&refImage,&quadGrid);
  }
  bVar1 = compareImages(this,&resImage,&refImage,0.05);
  (**(code **)(lVar4 + 0x1680))(0);
  description = "Fail";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar1,description);
  tcu::Surface::~Surface(&refImage);
  tcu::Surface::~Surface(&resImage);
  QuadGrid::~QuadGrid(&quadGrid);
  return STOP;
}

Assistant:

TestNode::IterateResult ShaderRenderCase::iterate(void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderRenderCase::iterate() begin");

	DE_ASSERT(m_program);
	deUint32 programID = m_program->getProgram();
	gl.useProgram(programID);

	// Create quad grid.
	IVec2 viewportSize = getViewportSize();
	int   width		   = viewportSize.x();
	int   height	   = viewportSize.y();

	// \todo [petri] Better handling of constCoords (render in multiple chunks, vary coords).
	QuadGrid quadGrid(m_isVertexCase ? GRID_SIZE : 4, width, height, Vec4(0.0f, 0.0f, 0.0f, 1.0f),
					  m_userAttribTransforms, m_textures);

	// Render result.
	Surface resImage(width, height);
	render(resImage, programID, quadGrid);

	// Compute reference.
	Surface refImage(width, height);
	if (m_isVertexCase)
		computeVertexReference(refImage, quadGrid);
	else
		computeFragmentReference(refImage, quadGrid);

	// Compare.
	bool testOk = compareImages(resImage, refImage, 0.05f);

	// De-initialize.
	gl.useProgram(0);

	m_testCtx.setTestResult(testOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, testOk ? "Pass" : "Fail");
	return TestNode::STOP;
}